

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usage.cc
# Opt level: O0

void absl::flags_internal::anon_unknown_0::FlagsHelpImpl
               (ostream *out,FlagKindFilter *filename_filter_cb,HelpFormat format,
               string_view program_usage_message)

{
  char *in_R9;
  string_view program_usage_message_00;
  anon_class_8_1_290f3d0c local_58;
  function<bool_(const_absl::CommandLineFlag_&)> local_50;
  HelpFormat local_2c;
  FlagKindFilter *pFStack_28;
  HelpFormat format_local;
  FlagKindFilter *filename_filter_cb_local;
  ostream *out_local;
  string_view program_usage_message_local;
  
  program_usage_message_local._M_len = (size_t)program_usage_message._M_str;
  out_local = (ostream *)program_usage_message._M_len;
  local_58.filename_filter_cb = filename_filter_cb;
  local_2c = format;
  pFStack_28 = filename_filter_cb;
  filename_filter_cb_local = (FlagKindFilter *)out;
  std::function<bool(absl::CommandLineFlag_const&)>::
  function<absl::flags_internal::(anonymous_namespace)::FlagsHelpImpl(std::ostream&,std::function<bool(std::basic_string_view<char,std::char_traits<char>>)>,absl::flags_internal::HelpFormat,std::basic_string_view<char,std::char_traits<char>>)::__0,void>
            ((function<bool(absl::CommandLineFlag_const&)> *)&local_50,&local_58);
  program_usage_message_00._M_str = in_R9;
  program_usage_message_00._M_len = program_usage_message_local._M_len;
  FlagsHelpImpl((anon_unknown_0 *)out,(ostream *)&local_50,(PerFlagFilter *)(ulong)local_2c,
                (HelpFormat)out_local,program_usage_message_00);
  std::function<bool_(const_absl::CommandLineFlag_&)>::~function(&local_50);
  return;
}

Assistant:

void FlagsHelpImpl(std::ostream& out,
                   flags_internal::FlagKindFilter filename_filter_cb,
                   HelpFormat format, absl::string_view program_usage_message) {
  FlagsHelpImpl(
      out,
      [&](const absl::CommandLineFlag& flag) {
        return filename_filter_cb && filename_filter_cb(flag.Filename());
      },
      format, program_usage_message);
}